

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::MapHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  anon_class_24_3_af332ec1_for_newObjectCreationFunction newObjectCreationFunction;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  Var pvVar6;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  JavascriptArray *newObj;
  JavascriptArray *this;
  JavascriptMethod p_Var7;
  TypedArrayBase *pTVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  char16_t *varName;
  uint uVar10;
  undefined4 uStack_ac;
  undefined8 local_90;
  Var element;
  JavascriptArray *local_80;
  ScriptContext *local_78;
  TypedArrayBase *local_70;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  local_70 = (TypedArrayBase *)pArr;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,pArr);
  local_31[0] = true;
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a64dcf:
    varName = L"[TypedArray].prototype.map";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.map";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar6 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar4) goto LAB_00a64dcf;
  pvVar6 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar6);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    element = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    element = Arguments::operator[](args,2);
  }
  if (local_70 == (TypedArrayBase *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar4) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
LAB_00a64887:
      typedArrayBase = (TypedArrayBase *)0x0;
    }
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    newObj = (JavascriptArray *)
             ArraySpeciesCreate<unsigned_int>
                       (obj,length,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
  }
  else {
    if (typedArrayBase == (TypedArrayBase *)0x0) goto LAB_00a64887;
    pvVar6 = Arguments::operator[](args,0);
    defaultConstructor = TypedArrayBase::GetDefaultConstructor(pvVar6,scriptContext);
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    instanceObj = (JavascriptFunction *)
                  JavascriptOperators::SpeciesConstructor
                            ((RecyclableObject *)typedArrayBase,defaultConstructor,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
    local_31[0] = false;
    bVar4 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar4) goto LAB_00a64eb0;
      *puVar9 = 0;
    }
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    newObjectCreationFunction._12_4_ = uStack_ac;
    newObjectCreationFunction.length = length;
    newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
    newObjectCreationFunction.scriptContext = scriptContext;
    pvVar6 = JavascriptOperators::
             NewObjectCreationHelper_ReentrancySafe<Js::JavascriptArray::MapHelper<unsigned_int>(Js::JavascriptArray*,Js::TypedArrayBase*,Js::RecyclableObject*,unsigned_int,Js::Arguments&,Js::ScriptContext*)::_lambda()_1_>
                       ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor,
                        scriptContext->threadContext,newObjectCreationFunction);
    newObj = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar6);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  }
  *(bool *)((long)local_68 + 0x108) = true;
  if (newObj == (JavascriptArray *)0x0) {
    this = JavascriptLibrary::CreateArray
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,length);
    EnsureHead<void*>(this);
    newObj = this;
  }
  else {
    this = TryVarToNonES5Array(newObj);
    if (this == (JavascriptArray *)0x0) {
      this = (JavascriptArray *)0x0;
    }
    else {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_68,this);
    }
  }
  local_90 = 0;
  local_80 = this;
  local_78 = scriptContext;
  if (local_70 == (TypedArrayBase *)0x0) {
LAB_00a64b22:
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      newObj = (JavascriptArray *)
               MapObjectHelper<unsigned_int>
                         (obj,length,0,(RecyclableObject *)newObj,this,local_31[0],
                          (RecyclableObject *)jsReentLock._24_8_,element,scriptContext);
      goto LAB_00a64dad;
    }
    bVar4 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
    if (!bVar4) {
      bVar4 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar4) goto LAB_00a64eb0;
        *puVar9 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar4 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)newObj);
    if (bVar4) {
      pTVar8 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)newObj);
    }
    else {
      pTVar8 = (TypedArrayBase *)0x0;
    }
    if (this == (JavascriptArray *)0x0 && pTVar8 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (bVar4) {
        *puVar9 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00a64eb0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    uVar10 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar10 < length) {
      length = uVar10;
    }
    local_70 = typedArrayBase;
    for (uVar10 = 0; length != uVar10; uVar10 = uVar10 + 1) {
      iVar5 = (*(local_70->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(local_70,(ulong)uVar10);
      local_90 = CONCAT44(extraout_var,iVar5);
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pTVar1 = scriptContext->threadContext;
      bVar4 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
      ThreadContext::AssertJsReentrancy(local_78->threadContext);
      p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var7);
      p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      uVar3 = local_90;
      pvVar6 = JavascriptNumber::ToVar(uVar10,local_78);
      pvVar6 = (*p_Var7)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                         0x2000004,0,0,0,0,0x2000004,element,uVar3,pvVar6,obj);
      pTVar1->reentrancySafeOrHandled = bVar4;
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      scriptContext = local_78;
      *(bool *)((long)local_68 + 0x108) = true;
      if (pTVar8 == (TypedArrayBase *)0x0) {
        (*(local_80->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_80,(ulong)uVar10,pvVar6,0);
      }
      else {
        *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        (*(pTVar8->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(pTVar8,(ulong)uVar10,pvVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_68);
        *(bool *)((long)local_68 + 0x108) = true;
      }
    }
  }
  else {
    bVar4 = IsNonES5Array(obj);
    if (!bVar4) {
      bVar4 = VarIsImpl<Js::ES5Array>(obj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2602,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) goto LAB_00a64eb0;
        *puVar9 = 0;
      }
      goto LAB_00a64b22;
    }
    for (uVar10 = 0; length != uVar10; uVar10 = uVar10 + 1) {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      iVar5 = (*(local_70->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x71])(local_70,(ulong)uVar10,&local_90);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      if (iVar5 != 0) {
        *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar1 = scriptContext->threadContext;
        bVar4 = pTVar1->reentrancySafeOrHandled;
        pTVar1->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
        ThreadContext::AssertJsReentrancy(local_78->threadContext);
        p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var7);
        p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        uVar3 = local_90;
        pvVar6 = JavascriptNumber::ToVar(uVar10,local_78);
        pvVar6 = (*p_Var7)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                           0x2000004,0,0,0,0,0x2000004,element,uVar3,pvVar6,local_70);
        pTVar1->reentrancySafeOrHandled = bVar4;
        JsReentLock::MutateArrayObject((JsReentLock *)local_68);
        scriptContext = local_78;
        *(bool *)((long)local_68 + 0x108) = true;
        if ((local_80 == (JavascriptArray *)0x0) || (local_31[0] != true)) {
          *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(newObj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(newObj,(ulong)uVar10,pvVar6,4);
          ThrowErrorOnFailure(iVar5,scriptContext,uVar10);
          JsReentLock::MutateArrayObject((JsReentLock *)local_68);
          *(bool *)((long)local_68 + 0x108) = true;
        }
        else {
          DirectSetItemAt<void*>(local_80,uVar10,pvVar6);
        }
        bVar4 = IsNonES5Array(obj);
        if (!bVar4) {
          bVar4 = VarIsImpl<Js::ES5Array>(obj);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x262b,"(VarIs<ES5Array>(obj))",
                                        "The array should have been converted to an ES5Array");
            if (!bVar4) goto LAB_00a64eb0;
            *puVar9 = 0;
          }
          *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          newObj = (JavascriptArray *)
                   MapObjectHelper<unsigned_int>
                             (obj,length,uVar10 + 1,(RecyclableObject *)newObj,local_80,local_31[0],
                              (RecyclableObject *)jsReentLock._24_8_,element,scriptContext);
          goto LAB_00a64dad;
        }
      }
    }
  }
  bVar4 = IsNonES5Array(newObj);
  if (bVar4) {
    (*(local_80->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
LAB_00a64dad:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return newObj;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }